

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::NodeEqualChecker::cmpSwitch
          (NodeEqualChecker *this,SwitchStatement *l,SwitchStatement *r)

{
  bool bVar1;
  size_type_conflict sVar2;
  size_type_conflict sVar3;
  Node *lhs;
  ArenaVector<SQCompilation::SwitchCase> *this_00;
  ArenaVector<SQCompilation::SwitchCase> *this_01;
  SwitchStatement *in_RDX;
  SwitchStatement *in_RSI;
  Node *in_RDI;
  SwitchCase *rc;
  SwitchCase *lc;
  int32_t i;
  ArenaVector<SQCompilation::SwitchCase> *rcases;
  ArenaVector<SQCompilation::SwitchCase> *lcases;
  SwitchCase *in_stack_ffffffffffffffb8;
  uint local_34;
  bool local_1;
  
  lhs = &SwitchStatement::expression(in_RSI)->super_Node;
  SwitchStatement::expression(in_RDX);
  bVar1 = check((NodeEqualChecker *)in_stack_ffffffffffffffb8,lhs,in_RDI);
  if (bVar1) {
    this_00 = SwitchStatement::cases(in_RSI);
    this_01 = SwitchStatement::cases(in_RDX);
    sVar2 = ArenaVector<SQCompilation::SwitchCase>::size(this_00);
    sVar3 = ArenaVector<SQCompilation::SwitchCase>::size(this_01);
    if (sVar2 == sVar3) {
      for (local_34 = 0; sVar2 = ArenaVector<SQCompilation::SwitchCase>::size(this_00),
          local_34 < sVar2; local_34 = local_34 + 1) {
        ArenaVector<SQCompilation::SwitchCase>::operator[](this_00,local_34);
        in_stack_ffffffffffffffb8 =
             ArenaVector<SQCompilation::SwitchCase>::operator[](this_01,local_34);
        bVar1 = check((NodeEqualChecker *)in_stack_ffffffffffffffb8,lhs,in_RDI);
        if (!bVar1) {
          return false;
        }
        bVar1 = check((NodeEqualChecker *)in_stack_ffffffffffffffb8,lhs,in_RDI);
        if (!bVar1) {
          return false;
        }
      }
      SwitchStatement::defaultCase(in_RSI);
      SwitchStatement::defaultCase(in_RDX);
      local_1 = check((NodeEqualChecker *)in_stack_ffffffffffffffb8,lhs,in_RDI);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool cmpSwitch(const SwitchStatement *l, const SwitchStatement *r) const {
    if (!check(l->expression(), r->expression()))
      return false;

    const auto &lcases = l->cases();
    const auto &rcases = r->cases();

    if (lcases.size() != rcases.size())
      return false;

    for (int32_t i = 0; i < lcases.size(); ++i) {
      const auto &lc = lcases[i];
      const auto &rc = rcases[i];

      if (!check(lc.val, rc.val))
        return false;

      if (!check(lc.stmt, rc.stmt))
        return false;
    }

    return check(l->defaultCase().stmt, r->defaultCase().stmt);
  }